

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall FloatInterval_Sqr_Test::TestBody(FloatInterval_Sqr_Test *this)

{
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  Interval<float> i_02;
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  float fVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  FloatInterval b2;
  FloatInterval bs;
  FloatInterval b;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  FloatInterval at;
  FloatInterval as;
  FloatInterval a;
  type *in_stack_fffffffffffffe58;
  AssertHelper *in_stack_fffffffffffffe60;
  AssertionResult *pAVar9;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  int iVar10;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined8 in_stack_fffffffffffffe88;
  Type type;
  AssertHelper *in_stack_fffffffffffffe90;
  AssertionResult *pAVar11;
  Interval<float> *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  Message *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffee4;
  AssertionResult local_118 [2];
  float local_f8;
  undefined4 local_f4;
  int *in_stack_ffffffffffffff10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  AssertionResult local_c8;
  undefined8 local_b8;
  Interval<float> local_b0;
  undefined8 local_a8;
  Interval<float> local_a0;
  undefined8 local_98;
  float local_80;
  float local_7c;
  AssertionResult local_78 [3];
  float local_48;
  float local_44;
  AssertionResult local_40;
  undefined8 local_30;
  Interval<float> local_28;
  undefined8 local_20;
  Interval<float> local_18;
  undefined8 local_10;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  type = (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_10 = 0x401000003fe00000;
  local_20 = 0x401000003fe00000;
  i.high._3_1_ = in_stack_fffffffffffffe6f;
  i._0_7_ = in_stack_fffffffffffffe68;
  auVar5._0_8_ = pbrt::Sqr<float>(i);
  auVar5._8_56_ = extraout_var;
  local_18 = (Interval<float>)vmovlpd_avx(auVar5._0_16_);
  local_30 = local_10;
  i_01.high._3_1_ = in_stack_fffffffffffffecf;
  i_01._0_7_ = in_stack_fffffffffffffec8;
  auVar6._0_8_ = pbrt::Interval<float>::operator*<float>(in_stack_fffffffffffffec0,i_01);
  auVar6._8_56_ = extraout_var_00;
  local_28 = (Interval<float>)vmovlpd_avx(auVar6._0_16_);
  local_44 = pbrt::Interval<float>::UpperBound(&local_18);
  local_48 = pbrt::Interval<float>::UpperBound(&local_28);
  pAVar11 = &local_40;
  testing::internal::EqHelper<false>::Compare<float,float>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (float *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (float *)in_stack_fffffffffffffe60);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar11);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90);
    testing::AssertionResult::failure_message((AssertionResult *)0x5f5af7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe90,type,
               (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x5f5b54);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f5bac);
  local_7c = pbrt::Interval<float>::LowerBound(&local_18);
  local_80 = pbrt::Interval<float>::LowerBound(&local_28);
  testing::internal::EqHelper<false>::Compare<float,float>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (float *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (float *)in_stack_fffffffffffffe60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90);
    testing::AssertionResult::failure_message((AssertionResult *)0x5f5c6e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe90,type,
               (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x5f5ccb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f5d23);
  local_98 = 0x3fa00000bf400000;
  local_a8 = 0x3fa00000bf400000;
  i_00.high._3_1_ = in_stack_fffffffffffffe6f;
  i_00._0_7_ = in_stack_fffffffffffffe68;
  auVar7._0_8_ = pbrt::Sqr<float>(i_00);
  auVar7._8_56_ = extraout_var_01;
  local_a0 = (Interval<float>)vmovlpd_avx(auVar7._0_16_);
  local_b8 = local_98;
  i_02.high._3_1_ = uVar1;
  i_02._0_7_ = in_stack_fffffffffffffec8;
  auVar8._0_8_ = pbrt::Interval<float>::operator*<float>((Interval<float> *)pAVar11,i_02);
  auVar8._8_56_ = extraout_var_02;
  local_b0 = (Interval<float>)vmovlpd_avx(auVar8._0_16_);
  pbrt::Interval<float>::UpperBound(&local_a0);
  pbrt::Interval<float>::UpperBound(&local_b0);
  pAVar11 = &local_c8;
  testing::internal::EqHelper<false>::Compare<float,float>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (float *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (float *)in_stack_fffffffffffffe60);
  iVar10 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar11);
  if (!bVar2) {
    testing::Message::Message((Message *)pAVar11);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x5f5e4d);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)pAVar11,type,
               (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),iVar10,
               in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x5f5eaa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f5f02);
  local_f4 = 0;
  local_f8 = pbrt::Interval<float>::LowerBound(&local_a0);
  pAVar9 = (AssertionResult *)&stack0xffffffffffffff10;
  testing::internal::EqHelper<true>::Compare<int,float>
            ((char *)pAVar9,in_stack_fffffffffffffe70,
             (int *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (float *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  iVar10 = (int)((ulong)pAVar9 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)pAVar11);
    in_stack_fffffffffffffe70 =
         testing::AssertionResult::failure_message((AssertionResult *)0x5f5fbe);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)pAVar11,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe80),iVar10
               ,in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x5f601b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f6070);
  fVar4 = pbrt::Interval<float>::LowerBound(&local_b0);
  uVar12 = 0;
  pAVar9 = local_118;
  testing::internal::CmpHelperLT<float,int>
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (float *)in_stack_ffffffffffffff18.ptr_,in_stack_ffffffffffffff10);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  if (!bVar2) {
    testing::Message::Message((Message *)pAVar11);
    testing::AssertionResult::failure_message((AssertionResult *)0x5f6127);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)pAVar11,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe80),iVar10
               ,in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(fVar4,uVar12),in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar9);
    testing::Message::~Message((Message *)0x5f6179);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f61cb);
  return;
}

Assistant:

TEST(FloatInterval, Sqr) {
    FloatInterval a = FloatInterval(1.75, 2.25);
    FloatInterval as = Sqr(a), at = a * a;
    EXPECT_EQ(as.UpperBound(), at.UpperBound());
    EXPECT_EQ(as.LowerBound(), at.LowerBound());

    // Straddle 0
    FloatInterval b = FloatInterval(-.75, 1.25);
    FloatInterval bs = Sqr(b), b2 = b * b;
    EXPECT_EQ(bs.UpperBound(), b2.UpperBound());
    EXPECT_EQ(0, bs.LowerBound());
    EXPECT_LT(b2.LowerBound(), 0);
}